

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char buf [64];
  int iVar18;
  int local_8c;
  ImVec2 local_80;
  ImVec2 local_78 [9];
  
  if ((flags & 0x700000U) != 0 && (flags & 0x1800000U) != 0) {
    return;
  }
  bVar10 = BeginPopup("context",0);
  pIVar9 = GImGui;
  if (!bVar10) {
    return;
  }
  uVar12 = GImGui->ColorEditOptions;
  if ((flags & 0x700000U) == 0) {
    bVar10 = RadioButton("RGB",(bool)((byte)(uVar12 >> 0x14) & 1));
    uVar11 = (uVar12 & 0xff8fffff) + 0x100000;
    if (!bVar10) {
      uVar11 = uVar12;
    }
    bVar10 = RadioButton("HSV",(bool)((byte)(uVar11 >> 0x15) & 1));
    uVar13 = uVar12 & 0xff8fffff | 0x200000;
    if (!bVar10) {
      uVar13 = uVar11;
    }
    bVar10 = RadioButton("Hex",(bool)((byte)(uVar13 >> 0x16) & 1));
    uVar12 = uVar13 & 0xff8fffff | 0x400000;
    if (!bVar10) {
      uVar12 = uVar13;
    }
    if ((flags & 0x1800000U) != 0) goto LAB_0017421f;
    if (GImGui->CurrentWindow->SkipItems == false) {
      SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
    }
  }
  else if ((flags & 0x1800000U) != 0) goto LAB_0017421f;
  bVar10 = RadioButton("0..255",(bool)((byte)(uVar12 >> 0x17) & 1));
  uVar11 = (uVar12 & 0xfe7fffff) + 0x800000;
  if (!bVar10) {
    uVar11 = uVar12;
  }
  bVar10 = RadioButton("0.00..1.00",(bool)((byte)(uVar11 >> 0x18) & 1));
  uVar12 = uVar12 & 0xfe7fffff | 0x1000000;
  if (!bVar10) {
    uVar12 = uVar11;
  }
LAB_0017421f:
  if (GImGui->CurrentWindow->SkipItems == false) {
    SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
  }
  local_78[0] = (ImVec2)vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
  bVar10 = ButtonEx("Copy as..",local_78,0);
  if (bVar10) {
    OpenPopup("Copy",0);
  }
  bVar10 = BeginPopup("Copy",0);
  if (bVar10) {
    fVar1 = *col;
    fVar2 = col[1];
    auVar16 = SUB6416(ZEXT464(0x3f800000),0);
    auVar6 = vminss_avx(auVar16,ZEXT416((uint)fVar1));
    auVar17 = ZEXT816(0) << 0x40;
    auVar5 = vcmpss_avx(ZEXT416((uint)fVar1),auVar17,1);
    auVar5 = vandnps_avx(auVar5,auVar6);
    auVar7 = vminss_avx(auVar16,ZEXT416((uint)fVar2));
    auVar6 = vcmpss_avx(ZEXT416((uint)fVar2),auVar17,1);
    auVar6 = vandnps_avx(auVar6,auVar7);
    fVar3 = col[2];
    auVar8 = vminss_avx(auVar16,ZEXT416((uint)fVar3));
    auVar7 = vcmpss_avx(ZEXT416((uint)fVar3),auVar17,1);
    auVar7 = vandnps_avx(auVar7,auVar8);
    if ((flags & 2U) == 0) {
      fVar4 = col[3];
      auVar16 = vminss_avx(auVar16,ZEXT416((uint)fVar4));
      auVar8 = vcmpss_avx(ZEXT416((uint)fVar4),auVar17,1);
      auVar8 = vandnps_avx(auVar8,auVar16);
      local_8c = (int)(auVar8._0_4_ * 255.0 + 0.5);
      dVar15 = (double)fVar4;
    }
    else {
      dVar15 = 1.0;
      local_8c = 0xff;
    }
    uVar11 = (uint)(auVar5._0_4_ * 255.0 + 0.5);
    uVar13 = (uint)(auVar6._0_4_ * 255.0 + 0.5);
    uVar14 = (uint)(auVar7._0_4_ * 255.0 + 0.5);
    ImFormatString((char *)local_78,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)",(double)fVar1,(double)fVar2,
                   (double)fVar3,dVar15);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar10 = Selectable((char *)local_78,false,0,&local_80);
    if (bVar10) {
      SetClipboardText((char *)local_78);
    }
    iVar18 = local_8c;
    ImFormatString((char *)local_78,0x40,"(%d,%d,%d,%d)",(ulong)uVar11,(ulong)uVar13,(ulong)uVar14,
                   local_8c);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar10 = Selectable((char *)local_78,false,0,&local_80);
    if (bVar10) {
      SetClipboardText((char *)local_78);
    }
    ImFormatString((char *)local_78,0x40,"#%02X%02X%02X",(ulong)uVar11,(ulong)uVar13,(ulong)uVar14,
                   iVar18);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar10 = Selectable((char *)local_78,false,0,&local_80);
    if (bVar10) {
      SetClipboardText((char *)local_78);
    }
    if ((flags & 2U) == 0) {
      ImFormatString((char *)local_78,0x40,"#%02X%02X%02X%02X",(ulong)uVar11,(ulong)uVar13,
                     (ulong)uVar14,local_8c);
      local_80.x = 0.0;
      local_80.y = 0.0;
      bVar10 = Selectable((char *)local_78,false,0,&local_80);
      if (bVar10) {
        SetClipboardText((char *)local_78);
      }
    }
    EndPopup();
  }
  pIVar9->ColorEditOptions = uVar12;
  EndPopup();
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags__DisplayMask);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags__DataTypeMask);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1, 0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}